

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::EnforceDirectoryLevelRules(cmMakefile *this)

{
  cmake *pcVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  string sStack_1a8;
  ostringstream msg;
  
  if (this->CheckCMP0000 == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar3 = std::operator<<((ostream *)&msg,"No cmake_minimum_required command is present.  ");
    poVar3 = std::operator<<(poVar3,"A line of code such as\n");
    poVar3 = std::operator<<(poVar3,"  cmake_minimum_required(VERSION ");
    cmVersion::GetMajorVersion();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,".");
    cmVersion::GetMinorVersion();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(poVar3,"should be added at the top of the file.  ");
    poVar3 = std::operator<<(poVar3,"The version specified may be lower if you wish to ");
    poVar3 = std::operator<<(poVar3,"support older CMake versions for this project.  ");
    poVar3 = std::operator<<(poVar3,"For more information run ");
    std::operator<<(poVar3,"\"cmake --help-policy CMP0000\".");
    PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0000,false);
    if (PVar2 - NEW < 3) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&sStack_1a8,&this->Backtrace);
      std::__cxx11::string::~string((string *)&sStack_1a8);
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else if (PVar2 == WARN) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,AUTHOR_WARNING,&sStack_1a8,&this->Backtrace);
      std::__cxx11::string::~string((string *)&sStack_1a8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  return;
}

Assistant:

void cmMakefile::EnforceDirectoryLevelRules() const
{
  // Diagnose a violation of CMP0000 if necessary.
  if (this->CheckCMP0000) {
    std::ostringstream msg;
    msg << "No cmake_minimum_required command is present.  "
        << "A line of code such as\n"
        << "  cmake_minimum_required(VERSION " << cmVersion::GetMajorVersion()
        << "." << cmVersion::GetMinorVersion() << ")\n"
        << "should be added at the top of the file.  "
        << "The version specified may be lower if you wish to "
        << "support older CMake versions for this project.  "
        << "For more information run "
        << "\"cmake --help-policy CMP0000\".";
    switch (this->GetPolicyStatus(cmPolicies::CMP0000)) {
      case cmPolicies::WARN:
        // Warn because the user did not provide a minimum required
        // version.
        this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                               msg.str(), this->Backtrace);
      case cmPolicies::OLD:
        // OLD behavior is to use policy version 2.4 set in
        // cmListFileCache.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // NEW behavior is to issue an error.
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               msg.str(), this->Backtrace);
        cmSystemTools::SetFatalErrorOccured();
        return;
    }
  }
}